

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<double>,testing::Matcher<double>,testing::Matcher<mp::var::Type>>,std::tuple<double,double,mp::var::Type>>
               (tuple<testing::Matcher<double>,_testing::Matcher<double>,_testing::Matcher<mp::var::Type>_>
                *matcher_tuple,tuple<double,_double,_mp::var::Type> *value_tuple)

{
  bool bVar1;
  
  bVar1 = TuplePrefix<1ul>::
          Matches<std::tuple<testing::Matcher<double>,testing::Matcher<double>,testing::Matcher<mp::var::Type>>,std::tuple<double,double,mp::var::Type>>
                    (matcher_tuple,value_tuple);
  if (bVar1) {
    bVar1 = MatcherBase<double>::Matches
                      ((MatcherBase<double> *)
                       &(matcher_tuple->
                        super__Tuple_impl<0UL,_testing::Matcher<double>,_testing::Matcher<double>,_testing::Matcher<mp::var::Type>_>
                        ).
                        super__Tuple_impl<1UL,_testing::Matcher<double>,_testing::Matcher<mp::var::Type>_>
                        .super__Head_base<1UL,_testing::Matcher<double>,_false>,
                       (value_tuple->super__Tuple_impl<0UL,_double,_double,_mp::var::Type>).
                       super__Tuple_impl<1UL,_double,_mp::var::Type>.
                       super__Head_base<1UL,_double,_false>._M_head_impl);
    return bVar1;
  }
  return false;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    using ::std::tr1::get;
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple)
        && get<N - 1>(matcher_tuple).Matches(get<N - 1>(value_tuple));
  }